

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prox.cpp
# Opt level: O3

void lts2::SoftThresholding(Mat *X1,Mat *X2,float threshold)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  
  iVar2 = *(int *)(X1 + 8);
  if (0 < iVar2) {
    iVar1 = *(int *)(X1 + 0xc);
    lVar6 = 0;
    do {
      if (0 < iVar1) {
        lVar4 = **(long **)(X1 + 0x48) * lVar6 + *(long *)(X1 + 0x10);
        lVar5 = **(long **)(X2 + 0x48) * lVar6 + *(long *)(X2 + 0x10);
        lVar3 = 0;
        do {
          fVar7 = hypotf(*(float *)(lVar4 + lVar3 * 4),*(float *)(lVar5 + lVar3 * 4));
          if (fVar7 < 1e-06) {
LAB_00112685:
            *(undefined4 *)(lVar4 + lVar3 * 4) = 0;
            fVar7 = 0.0;
          }
          else {
            *(float *)(lVar4 + lVar3 * 4) = *(float *)(lVar4 + lVar3 * 4) / fVar7;
            *(float *)(lVar5 + lVar3 * 4) = *(float *)(lVar5 + lVar3 * 4) / fVar7;
            fVar7 = fVar7 - threshold;
            if (fVar7 <= 0.0) goto LAB_00112685;
            *(float *)(lVar4 + lVar3 * 4) = *(float *)(lVar4 + lVar3 * 4) * fVar7;
            fVar7 = fVar7 * *(float *)(lVar5 + lVar3 * 4);
          }
          *(float *)(lVar5 + lVar3 * 4) = fVar7;
          iVar1 = *(int *)(X1 + 0xc);
          lVar3 = lVar3 + 1;
        } while ((int)lVar3 < iVar1);
        iVar2 = *(int *)(X1 + 8);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar2);
  }
  return;
}

Assistant:

void lts2::SoftThresholding(cv::Mat &X1, cv::Mat &X2, float threshold)
{
  for (int y = 0; y < X1.rows; ++y)
  {
    float* p_x1 = X1.ptr<float>(y);
    float* p_x2 = X2.ptr<float>(y);
        
    for (int x = 0; x < X1.cols; ++x, ++p_x1, ++p_x2)
    {
      float absX = hypotf(*p_x1, *p_x2);
            
      if ( absX < 1e-6 )
      {
        *p_x1 = 0.0;
        *p_x2 = 0.0;
      }
      else 
      {
        *p_x1 /= absX;
        *p_x2 /= absX;

        absX -= threshold;
                
        if ( absX > 0.0 )
        {
          *p_x1 *= absX;
          *p_x2 *= absX;
        }
        else
        {
          *p_x1 = 0.0;
          *p_x2 = 0.0;
        }
      }
    }
  }
}